

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O3

void __thiscall
cfd::core::AbstractTransaction::AddTxOut
          (AbstractTransaction *this,Amount *value,Script *locking_script)

{
  void *pvVar1;
  int64_t iVar2;
  CfdException *this_00;
  int ret;
  int local_5c;
  undefined1 local_58 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  Script::GetData((ByteData *)local_58,locking_script);
  ByteData::GetBytes(&local_38,(ByteData *)local_58);
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_);
  }
  pvVar1 = this->wally_tx_pointer_;
  iVar2 = Amount::GetSatoshiValue(value);
  local_5c = wally_tx_add_raw_output
                       (pvVar1,iVar2,
                        local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_38.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,0);
  if (local_5c == 0) {
    if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_58._0_8_ = "cfdcore_transaction_common.cpp";
  local_58._8_4_ = 0x222;
  local_58._16_8_ = "AddTxOut";
  logger::log<int&>((CfdSourceLocation *)local_58,kCfdLogLevelWarning,
                    "wally_tx_add_raw_output NG[{}].",&local_5c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._0_8_ = local_58 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"vout add error.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void AbstractTransaction::AddTxOut(
    const Amount &value, const Script &locking_script) {
  const std::vector<uint8_t> &script_data =
      locking_script.GetData().GetBytes();
  int ret = wally_tx_add_raw_output(
      static_cast<struct wally_tx *>(wally_tx_pointer_),
      value.GetSatoshiValue(), script_data.data(), script_data.size(), 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_raw_output NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "vout add error.");
  }
}